

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::EndAt(LocationRecorder *this,Token *token)

{
  int iVar1;
  int32 iVar2;
  
  iVar1 = token->line;
  iVar2 = SourceCodeInfo_Location::_internal_span(this->location_,0);
  if (iVar1 != iVar2) {
    SourceCodeInfo_Location::_internal_add_span(this->location_,token->line);
  }
  SourceCodeInfo_Location::_internal_add_span(this->location_,token->end_column);
  return;
}

Assistant:

void Parser::LocationRecorder::EndAt(const io::Tokenizer::Token& token) {
  if (token.line != location_->span(0)) {
    location_->add_span(token.line);
  }
  location_->add_span(token.end_column);
}